

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevoluteSpherical.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkRevoluteSpherical::ChLinkRevoluteSpherical
          (ChLinkRevoluteSpherical *this,ChLinkRevoluteSpherical *other)

{
  undefined1 auVar1 [64];
  ChBodyFrame *pCVar2;
  ChBodyFrame *pCVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  ChLink::ChLink(&this->super_ChLink,&other->super_ChLink);
  (this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLinkRevoluteSpherical_00b1d708;
  auVar1 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  this->m_pos1 = (ChVector<double>)auVar1._0_24_;
  this->m_pos2 = (ChVector<double>)auVar1._24_24_;
  (this->m_dir1).m_data[0] = (double)auVar1._48_8_;
  (this->m_dir1).m_data[1] = (double)auVar1._56_8_;
  (this->m_dir1).m_data[2] = 0.0;
  ChConstraintTwoBodies::ChConstraintTwoBodies(&this->m_cnstr_dist);
  ChConstraintTwoBodies::ChConstraintTwoBodies(&this->m_cnstr_dot);
  pCVar2 = (other->super_ChLink).Body1;
  pCVar3 = (other->super_ChLink).Body2;
  (this->super_ChLink).Body1 = pCVar2;
  (this->super_ChLink).Body2 = pCVar3;
  (this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.system =
       (other->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.system;
  if (other != this) {
    (this->m_pos1).m_data[0] = (other->m_pos1).m_data[0];
    (this->m_pos1).m_data[1] = (other->m_pos1).m_data[1];
    (this->m_pos1).m_data[2] = (other->m_pos1).m_data[2];
    (this->m_pos2).m_data[0] = (other->m_pos2).m_data[0];
    (this->m_pos2).m_data[1] = (other->m_pos2).m_data[1];
    (this->m_pos2).m_data[2] = (other->m_pos2).m_data[2];
    (this->m_dir1).m_data[0] = (other->m_dir1).m_data[0];
    (this->m_dir1).m_data[1] = (other->m_dir1).m_data[1];
    (this->m_dir1).m_data[2] = (other->m_dir1).m_data[2];
  }
  dVar4 = other->m_cur_dist;
  this->m_dist = other->m_dist;
  this->m_cur_dist = dVar4;
  this->m_cur_dot = other->m_cur_dot;
  iVar5 = (*(pCVar2->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[0x10])();
  iVar6 = (*(((other->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_dist,(ChVariables *)CONCAT44(extraout_var,iVar5),
             (ChVariables *)CONCAT44(extraout_var_00,iVar6));
  iVar5 = (*(((other->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  iVar6 = (*(((other->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_dot,(ChVariables *)CONCAT44(extraout_var_01,iVar5),
             (ChVariables *)CONCAT44(extraout_var_02,iVar6));
  this->m_multipliers[0] = other->m_multipliers[0];
  this->m_multipliers[1] = other->m_multipliers[1];
  return;
}

Assistant:

ChLinkRevoluteSpherical::ChLinkRevoluteSpherical(const ChLinkRevoluteSpherical& other) : ChLink(other) {
    Body1 = other.Body1;
    Body2 = other.Body2;
    system = other.system;

    m_pos1 = other.m_pos1;
    m_pos2 = other.m_pos2;
    m_dir1 = other.m_dir1;
    m_dist = other.m_dist;
    m_cur_dist = other.m_cur_dist;
    m_cur_dot = other.m_cur_dot;

    m_cnstr_dist.SetVariables(&other.Body1->Variables(), &other.Body2->Variables());
    m_cnstr_dot.SetVariables(&other.Body1->Variables(), &other.Body2->Variables());

    m_multipliers[0] = other.m_multipliers[0];
    m_multipliers[1] = other.m_multipliers[1];
}